

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

ssize_t ssl_cf_recv(Curl_cfilter *cf,Curl_easy *data,char *buf,size_t len,CURLcode *err)

{
  CURLcode CVar1;
  _Bool local_49;
  long lStack_48;
  _Bool done;
  ssize_t nread;
  cf_call_data save;
  ssl_connect_data *connssl;
  CURLcode *err_local;
  size_t len_local;
  char *buf_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  save.data = (Curl_easy *)cf->ctx;
  nread = *(ssize_t *)((long)cf->ctx + 0x48);
  *(Curl_easy **)((long)cf->ctx + 0x48) = data;
  *err = CURLE_OK;
  if ((int)((save.data)->req).size == 1) {
    local_49 = false;
    CVar1 = ssl_cf_connect_deferred(cf,data,(void *)0x0,0,&local_49);
    *err = CVar1;
    if (*err != CURLE_OK) {
      lStack_48 = -1;
      goto LAB_001bc672;
    }
    if ((local_49 & 1U) == 0) {
      *err = CURLE_AGAIN;
      lStack_48 = -1;
      goto LAB_001bc672;
    }
  }
  lStack_48 = (**(code **)(*(long *)save.data + 0xa8))(cf,data,buf,len,err);
  if ((lStack_48 < 1) && (lStack_48 == 0)) {
    *err = CURLE_OK;
  }
LAB_001bc672:
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
    Curl_trc_cf_infof(data,cf,"cf_recv(len=%zu) -> %zd, %d",len,lStack_48,(ulong)*err);
  }
  *(ssize_t *)((long)cf->ctx + 0x48) = nread;
  return lStack_48;
}

Assistant:

static ssize_t ssl_cf_recv(struct Curl_cfilter *cf,
                           struct Curl_easy *data, char *buf, size_t len,
                           CURLcode *err)
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct cf_call_data save;
  ssize_t nread;

  CF_DATA_SAVE(save, cf, data);
  *err = CURLE_OK;
  if(connssl->state == ssl_connection_deferred) {
    bool done = FALSE;
    *err = ssl_cf_connect_deferred(cf, data, NULL, 0, &done);
    if(*err) {
      nread = -1;
      goto out;
    }
    else if(!done) {
      *err = CURLE_AGAIN;
      nread = -1;
      goto out;
    }
    DEBUGASSERT(connssl->state == ssl_connection_complete);
  }

  nread = connssl->ssl_impl->recv_plain(cf, data, buf, len, err);
  if(nread > 0) {
    DEBUGASSERT((size_t)nread <= len);
  }
  else if(nread == 0) {
    /* eof */
    *err = CURLE_OK;
  }

out:
  CURL_TRC_CF(data, cf, "cf_recv(len=%zu) -> %zd, %d", len,
              nread, *err);
  CF_DATA_RESTORE(cf, save);
  return nread;
}